

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O3

cbtCollisionObject * __thiscall
cbtCollisionWorldImporter::getCollisionObjectByName(cbtCollisionWorldImporter *this,char *name)

{
  int iVar1;
  cbtCollisionObject *pcVar2;
  cbtCollisionObject **ppcVar3;
  cbtHashString local_40;
  
  cbtHashString::cbtHashString(&local_40,name);
  iVar1 = cbtHashMap<cbtHashString,_cbtCollisionObject_*>::findIndex
                    (&this->m_nameColObjMap,&local_40);
  ppcVar3 = (cbtCollisionObject **)0x0;
  if (iVar1 != -1) {
    ppcVar3 = (this->m_nameColObjMap).m_valueArray.m_data + iVar1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_string1._M_dataplus._M_p != &local_40.m_string1.field_2) {
    operator_delete(local_40.m_string1._M_dataplus._M_p,
                    local_40.m_string1.field_2._M_allocated_capacity + 1);
  }
  if ((ppcVar3 == (cbtCollisionObject **)0x0) ||
     (pcVar2 = *ppcVar3, pcVar2 == (cbtCollisionObject *)0x0)) {
    pcVar2 = (cbtCollisionObject *)0x0;
  }
  return pcVar2;
}

Assistant:

cbtCollisionObject* cbtCollisionWorldImporter::getCollisionObjectByName(const char* name)
{
	cbtCollisionObject** bodyPtr = m_nameColObjMap.find(name);
	if (bodyPtr && *bodyPtr)
	{
		return *bodyPtr;
	}
	return 0;
}